

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk.cpp
# Opt level: O3

void __thiscall duckdb::DataChunk::Deserialize(DataChunk *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  Allocator *allocator;
  undefined4 extraout_var_00;
  reference this_00;
  idx_t capacity_p;
  size_type __n;
  long lVar3;
  ulong count;
  vector<duckdb::LogicalType,_true> types;
  vector<duckdb::LogicalType,_true> local_68;
  List local_50;
  LogicalType local_48;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"rows");
  uVar1 = (*deserializer->_vptr_Deserializer[0x13])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  local_68.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"types");
  iVar2 = (*deserializer->_vptr_Deserializer[8])(deserializer);
  lVar3 = CONCAT44(extraout_var,iVar2);
  local_50.deserializer = deserializer;
  if (lVar3 != 0) {
    do {
      Deserializer::List::ReadElement<duckdb::LogicalType>(&local_48,&local_50);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68,
                 &local_48);
      LogicalType::~LogicalType(&local_48);
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  (*deserializer->_vptr_Deserializer[9])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  allocator = Allocator::DefaultAllocator();
  count = (ulong)uVar1;
  capacity_p = 0x800;
  if (0x800 < count) {
    capacity_p = count;
  }
  Initialize(this,allocator,&local_68,capacity_p);
  this->count = count;
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"columns");
  iVar2 = (*deserializer->_vptr_Deserializer[8])(deserializer);
  if (CONCAT44(extraout_var_00,iVar2) != 0) {
    __n = 0;
    do {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      this_00 = vector<duckdb::Vector,_true>::operator[](&this->data,__n);
      Vector::Deserialize(this_00,deserializer,count);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      __n = __n + 1;
    } while (CONCAT44(extraout_var_00,iVar2) != __n);
  }
  (*deserializer->_vptr_Deserializer[9])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68);
  return;
}

Assistant:

void DataChunk::Deserialize(Deserializer &deserializer) {

	// read and set the row count
	auto row_count = deserializer.ReadProperty<sel_t>(100, "rows");

	// read the types
	vector<LogicalType> types;
	deserializer.ReadList(101, "types", [&](Deserializer::List &list, idx_t i) {
		auto type = list.ReadElement<LogicalType>();
		types.push_back(type);
	});

	// initialize the data chunk
	D_ASSERT(!types.empty());
	Initialize(Allocator::DefaultAllocator(), types, MaxValue<idx_t>(row_count, STANDARD_VECTOR_SIZE));
	SetCardinality(row_count);

	// read the data
	deserializer.ReadList(102, "columns", [&](Deserializer::List &list, idx_t i) {
		list.ReadObject([&](Deserializer &object) { data[i].Deserialize(object, row_count); });
	});
}